

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O1

Error asmjit::Formatter::formatFuncValuePack
                (String *sb,uint32_t formatFlags,BaseEmitter *emitter,FuncValuePack *pack,
                VirtReg **vRegs)

{
  byte bVar1;
  uint uVar2;
  VirtReg *pVVar3;
  Error EVar4;
  ulong uVar5;
  ulong uVar6;
  char *pcVar7;
  char cVar8;
  int iVar9;
  Error unaff_R14D;
  bool bVar10;
  
  iVar9 = 5;
  uVar5 = 3;
  do {
    if (uVar5 == 0xffffffffffffffff) {
      iVar9 = 0;
      break;
    }
    uVar6 = uVar5 & 0xffffffff;
    iVar9 = iVar9 + -1;
    uVar5 = uVar5 - 1;
  } while (pack->_values[uVar6]._data == 0);
  if (iVar9 == 0) {
    EVar4 = String::_opString(sb,1,"void",0xffffffffffffffff);
    return EVar4;
  }
  if (iVar9 != 1) {
    String::_opChar(sb,1,'[');
  }
  uVar5 = 0;
  do {
    if (pack->_values[uVar5]._data == 0) {
      cVar8 = '\x02';
      EVar4 = unaff_R14D;
LAB_0011a3d1:
      bVar10 = false;
      unaff_R14D = EVar4;
    }
    else {
      if (uVar5 != 0) {
        cVar8 = '\x01';
        EVar4 = String::_opString(sb,1,", ",0xffffffffffffffff);
        if (EVar4 != 0) goto LAB_0011a3d1;
      }
      uVar2 = pack->_values[uVar5]._data;
      EVar4 = formatTypeId(sb,uVar2 & 0xff);
      if (EVar4 == 0) {
        if ((uVar2 & 0x300) == 0) {
LAB_0011a3a2:
          EVar4 = 0;
        }
        else {
          EVar4 = String::_opChar(sb,1,'@');
          if ((EVar4 == 0) &&
             (((uVar2 >> 10 & 1) == 0 || (EVar4 = String::_opChar(sb,1,'['), EVar4 == 0)))) {
            if ((uVar2 >> 8 & 1) != 0) {
              bVar1 = (emitter->_environment)._arch;
              EVar4 = 4;
              if (bVar1 - 1 < 2) {
                EVar4 = x86::FormatterInternal::formatRegister
                                  (sb,formatFlags,emitter,(uint)bVar1,uVar2 >> 0x18,
                                   uVar2 >> 0x10 & 0xff);
              }
              if (EVar4 != 0) goto LAB_0011a3a5;
            }
            if ((((uVar2 >> 9 & 1) == 0) ||
                (EVar4 = String::_opFormat(sb,1,"[%d]",(ulong)(uint)((int)uVar2 >> 0xc)), EVar4 == 0
                )) && (((uVar2 >> 10 & 1) == 0 || (EVar4 = String::_opChar(sb,1,']'), EVar4 == 0))))
            goto LAB_0011a3a2;
          }
        }
      }
LAB_0011a3a5:
      bVar10 = EVar4 == 0;
      cVar8 = !bVar10;
      if (!bVar10) {
        unaff_R14D = EVar4;
      }
      if (vRegs != (VirtReg **)0x0 && !(bool)cVar8) {
        pVVar3 = vRegs[uVar5];
        pcVar7 = "<none>";
        if (pVVar3 != (VirtReg *)0x0) {
          if (*(uint *)&(pVVar3->_name).field_0 < 0xc) {
            pcVar7 = (char *)((long)&(pVVar3->_name).field_0 + 4);
          }
          else {
            pcVar7 = *(char **)((long)&(pVVar3->_name).field_0 + 8);
          }
        }
        EVar4 = String::_opFormat(sb,1," %s",pcVar7);
        bVar10 = EVar4 == 0;
        cVar8 = !bVar10;
        if (!bVar10) {
          unaff_R14D = EVar4;
        }
      }
    }
    if (!bVar10) goto LAB_0011a438;
    uVar5 = uVar5 + 1;
  } while (iVar9 + (uint)(iVar9 == 0) != uVar5);
  cVar8 = '\x02';
LAB_0011a438:
  EVar4 = 0;
  if (cVar8 != '\x02') {
    EVar4 = unaff_R14D;
  }
  if ((iVar9 != 1) && (cVar8 == '\x02')) {
    String::_opChar(sb,1,']');
    EVar4 = 0;
  }
  return EVar4;
}

Assistant:

static Error formatFuncValuePack(
  String& sb,
  uint32_t formatFlags,
  const BaseEmitter* emitter,
  const FuncValuePack& pack,
  VirtReg* const* vRegs) noexcept {

  size_t count = pack.count();
  if (!count)
    return sb.append("void");

  if (count > 1)
    sb.append('[');

  for (uint32_t valueIndex = 0; valueIndex < count; valueIndex++) {
    const FuncValue& value = pack[valueIndex];
    if (!value)
      break;

    if (valueIndex)
      ASMJIT_PROPAGATE(sb.append(", "));

    ASMJIT_PROPAGATE(formatFuncValue(sb, formatFlags, emitter, value));

    if (vRegs) {
      static const char nullRet[] = "<none>";
      ASMJIT_PROPAGATE(sb.appendFormat(" %s", vRegs[valueIndex] ? vRegs[valueIndex]->name() : nullRet));
    }
  }

  if (count > 1)
    sb.append(']');

  return kErrorOk;
}